

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::base::TypedConfigurations::~TypedConfigurations(TypedConfigurations *this)

{
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012c5e8;
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_logFlushThresholdMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_maxLogFileSizeMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_fileStreamMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_performanceTrackingMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_el::base::SubsecondPrecision>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_subsecondPrecisionMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_el::base::LogFormat>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_logFormatMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_toStandardOutputMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_filenameMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_toFileMap)._M_h);
  utils::std::
  _Hashtable<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_enabledMap)._M_h);
  return;
}

Assistant:

virtual ~TypedConfigurations(void) {
  }